

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O3

bool __thiscall WorkerFlow::work(WorkerFlow *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *__s;
  size_t sVar4;
  zmq_pollitem_t items [2];
  void *local_48;
  ulong local_40;
  void *local_38;
  ulong local_30;
  
  local_48 = this->m_stream_socket;
  local_40 = 0x100000000;
  local_38 = this->m_notif_socket;
  local_30 = 0x100000000;
  iVar2 = zmq_poll(&local_48,2,0xffffffffffffffff);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    do {
      if (*piVar3 != 4) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"zmq_poll: retrying",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar2 = zmq_poll(&local_48,2,0xffffffffffffffff);
    } while (iVar2 == -1);
  }
  if ((local_40 & 0x1000000000000) == 0) {
    if ((local_30 & 0x1000000000000) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Panic! > ",9);
      piVar3 = __errno_location();
      __s = strerror(*piVar3);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d1a0);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      bVar1 = false;
    }
    else {
      bVar1 = recv_notif(this);
    }
  }
  else {
    recv_stream(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool WorkerFlow::work()
{
    // zmq_pollitem_t.socket  = zmq obscure socket
    // zmq_pollitem_t.fd      = socket fd
    // zmq_pollitem_t.events  = what to poll
    // zmq_pollitem_t.revents = what was catched
    zmq_pollitem_t items[] = {
        { m_stream_socket, 0, ZMQ_POLLIN, 0 },
        { m_notif_socket,  0, ZMQ_POLLIN, 0 }
    };
    // Wait until there is data to read in either channel
    int timeout = -1; // return inmediatly
    while (zmq_poll(items, 2, timeout) == -1 && errno == EINTR) {
        std::cout << "zmq_poll: retrying" << std::endl;
    }

    // Multiplex channels
    // If stream socket has data to read
    if (items[0].revents & ZMQ_POLLIN) {
        return recv_stream();
    }
    // If notification channel has data to read
    if (items[1].revents & ZMQ_POLLIN) {
        return recv_notif();
    }
    
    // zmq_poll failed with errno != EINTR
    std::cout << "Panic! > " << strerror(errno) << std::endl;
    return false;
}